

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

bool __thiscall mp::internal::SolverAppOptionParser::ShowSolveResults(SolverAppOptionParser *this)

{
  _Rb_tree_color _Var1;
  BasicSolver *pBVar2;
  _Base_ptr p_Var3;
  _Rb_tree_color local_3c;
  pointer local_38;
  
  local_38 = (this->solver_->long_name_)._M_dataplus._M_p;
  BasicSolver::Print<char_const*>(this->solver_,(CStringRef)0x382e03,&local_38);
  pBVar2 = this->solver_;
  for (p_Var3 = (pBVar2->super_SolveResultRegistry).registry_._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(pBVar2->super_SolveResultRegistry).registry_._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    _Var1 = p_Var3[1]._M_color;
    if (_Var1 == *(_Rb_tree_color *)&p_Var3[1].field_0x4) {
      local_38 = (pointer)CONCAT44(local_38._4_4_,_Var1);
      BasicSolver::Print<int,std::__cxx11::string>
                (this->solver_,(CStringRef)0x382e1e,(int *)&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &p_Var3[1]._M_parent);
    }
    else {
      local_38 = (pointer)CONCAT44(local_38._4_4_,_Var1);
      local_3c = *(_Rb_tree_color *)&p_Var3[1].field_0x4;
      BasicSolver::Print<int,int,std::__cxx11::string>
                (this->solver_,(CStringRef)0x382e2c,(int *)&local_38,(int *)&local_3c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &p_Var3[1]._M_parent);
    }
  }
  return false;
}

Assistant:

bool SolverAppOptionParser::ShowSolveResults() {
  solver_.Print("Solve result table for {}\n", solver_.long_name());
  for (const auto& sr: solver_.GetSolveResultRegistry()) {
    if (sr.isSingle())
      solver_.Print("\t    {:3}\t{}\n", sr.first(), sr.descr());
    else     // range, printing as a header
      solver_.Print("\t{:3}-{:3}\t{}\n",
                    sr.first(), sr.last(), sr.descr());
  }
  return false;
}